

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_sofa_c.c
# Opt level: O0

void t_nutm80(int *status)

{
  double rmatn [3] [3];
  int *in_stack_ffffffffffffffb8;
  double (*in_stack_ffffffffffffffc0) [3];
  char *in_stack_ffffffffffffffc8;
  double in_stack_ffffffffffffffd0;
  double in_stack_ffffffffffffffd8;
  double in_stack_ffffffffffffffe0;
  
  iauNutm80(in_stack_ffffffffffffffd0,(double)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  vvd(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
      in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  vvd(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
      in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  vvd(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
      in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  vvd(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
      in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  vvd(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
      in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  vvd(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
      in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  vvd(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
      in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  vvd(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
      in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  vvd(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
      in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

static void t_nutm80(int *status)
/*
**  - - - - - - - - -
**   t _ n u t m 8 0
**  - - - - - - - - -
**
**  Test iauNutm80 function.
**
**  Returned:
**     status    int         FALSE = success, TRUE = fail
**
**  Called:  iauNutm80, vvd
**
**  This revision:  2013 August 7
*/
{
   double rmatn[3][3];


   iauNutm80(2400000.5, 53736.0, rmatn);

   vvd(rmatn[0][0], 0.9999999999534999268, 1e-12,
      "iauNutm80", "11", status);
   vvd(rmatn[0][1], 0.8847935789636432161e-5, 1e-12,
      "iauNutm80", "12", status);
   vvd(rmatn[0][2], 0.3835906502164019142e-5, 1e-12,
      "iauNutm80", "13", status);

   vvd(rmatn[1][0], -0.8847780042583435924e-5, 1e-12,
      "iauNutm80", "21", status);
   vvd(rmatn[1][1], 0.9999999991366569963, 1e-12,
      "iauNutm80", "22", status);
   vvd(rmatn[1][2], -0.4060052702727130809e-4, 1e-12,
      "iauNutm80", "23", status);

   vvd(rmatn[2][0], -0.3836265729708478796e-5, 1e-12,
      "iauNutm80", "31", status);
   vvd(rmatn[2][1], 0.4060049308612638555e-4, 1e-12,
      "iauNutm80", "32", status);
   vvd(rmatn[2][2], 0.9999999991684415129, 1e-12,
      "iauNutm80", "33", status);

}